

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O1

Bool GetRgb(ctmbstr color,int *rgb)

{
  char cVar1;
  uint uVar2;
  Bool BVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  int iVar7;
  long lVar8;
  int *piVar9;
  
  piVar9 = colorValues[0] + 2;
  lVar8 = 0;
  do {
    pcVar6 = strstr((char *)((long)&colorNames_rel + (long)*(int *)((long)&colorNames_rel + lVar8)),
                    color);
    if (pcVar6 != (char *)0x0) {
      *(undefined8 *)rgb = *(undefined8 *)*(int (*) [3])(piVar9 + -2);
      iVar4 = *piVar9;
      goto LAB_00139fb9;
    }
    lVar8 = lVar8 + 4;
    piVar9 = piVar9 + 3;
  } while (lVar8 != 0x40);
  uVar2 = prvTidytmbstrlen(color);
  BVar3 = no;
  if ((uVar2 == 7) && (*color == '#')) {
    cVar1 = color[1];
    iVar4 = (int)cVar1;
    if ((byte)(cVar1 - 0x30U) < 10) {
      iVar5 = iVar4 + -0x30;
    }
    else if ((byte)(cVar1 + 0x9fU) < 6) {
      iVar5 = iVar4 + -0x57;
    }
    else {
      iVar5 = -1;
      if ((byte)(cVar1 + 0xbfU) < 6) {
        iVar5 = iVar4 + -0x37;
      }
    }
    cVar1 = color[2];
    iVar4 = (int)cVar1;
    if ((byte)(cVar1 - 0x30U) < 10) {
      iVar7 = iVar4 + -0x30;
    }
    else if ((byte)(cVar1 + 0x9fU) < 6) {
      iVar7 = iVar4 + -0x57;
    }
    else {
      iVar7 = -1;
      if ((byte)(cVar1 + 0xbfU) < 6) {
        iVar7 = iVar4 + -0x37;
      }
    }
    *rgb = iVar7 + iVar5 * 0x10;
    cVar1 = color[3];
    iVar4 = (int)cVar1;
    if ((byte)(cVar1 - 0x30U) < 10) {
      iVar5 = iVar4 + -0x30;
    }
    else if ((byte)(cVar1 + 0x9fU) < 6) {
      iVar5 = iVar4 + -0x57;
    }
    else {
      iVar5 = -1;
      if ((byte)(cVar1 + 0xbfU) < 6) {
        iVar5 = iVar4 + -0x37;
      }
    }
    cVar1 = color[4];
    iVar4 = (int)cVar1;
    if ((byte)(cVar1 - 0x30U) < 10) {
      iVar7 = iVar4 + -0x30;
    }
    else if ((byte)(cVar1 + 0x9fU) < 6) {
      iVar7 = iVar4 + -0x57;
    }
    else {
      iVar7 = -1;
      if ((byte)(cVar1 + 0xbfU) < 6) {
        iVar7 = iVar4 + -0x37;
      }
    }
    rgb[1] = iVar7 + iVar5 * 0x10;
    cVar1 = color[5];
    iVar4 = (int)cVar1;
    if ((byte)(cVar1 - 0x30U) < 10) {
      iVar5 = iVar4 + -0x30;
    }
    else if ((byte)(cVar1 + 0x9fU) < 6) {
      iVar5 = iVar4 + -0x57;
    }
    else {
      iVar5 = -1;
      if ((byte)(cVar1 + 0xbfU) < 6) {
        iVar5 = iVar4 + -0x37;
      }
    }
    cVar1 = color[6];
    iVar7 = (int)cVar1;
    if ((byte)(cVar1 - 0x30U) < 10) {
      iVar4 = iVar7 + -0x30;
    }
    else if ((byte)(cVar1 + 0x9fU) < 6) {
      iVar4 = iVar7 + -0x57;
    }
    else {
      iVar4 = -1;
      if ((byte)(cVar1 + 0xbfU) < 6) {
        iVar4 = iVar7 + -0x37;
      }
    }
    iVar4 = iVar4 + iVar5 * 0x10;
LAB_00139fb9:
    rgb[2] = iVar4;
    BVar3 = yes;
  }
  return BVar3;
}

Assistant:

static Bool GetRgb( ctmbstr color, int rgb[] )
{
    uint x;

    /* Check if we have a color name */
    for (x = 0; x < N_COLORS; x++)
    {
        if ( strstr(colorNames[x], color) != NULL )
        {
            rgb[0] = colorValues[x][0];
            rgb[1] = colorValues[x][1];
            rgb[2] = colorValues[x][2];
            return yes;
        }
    }

    /*
       No color name so must be hex values 
       Is this a number in hexadecimal format?
    */
    
    /* Must be 7 characters in the RGB value (including '#') */
    if ( TY_(tmbstrlen)(color) == 7 && color[0] == '#' )
    {
        rgb[0] = (ctox(color[1]) * 16) + ctox(color[2]);
        rgb[1] = (ctox(color[3]) * 16) + ctox(color[4]);
        rgb[2] = (ctox(color[5]) * 16) + ctox(color[6]);
        return yes;
    }
    return no;
}